

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptListIterator.cpp
# Opt level: O3

void __thiscall
Js::JavascriptListIterator::JavascriptListIterator
          (JavascriptListIterator *this,DynamicType *type,ListForListIterator *list)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014ee7c8;
  Memory::Recycler::WBSetBit((char *)&this->listForIterator);
  (this->listForIterator).ptr = list;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->listForIterator);
  this->index = 0;
  if ((type->super_Type).typeId != TypeIds_ListIterator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptListIterator.cpp"
                                ,0xe,"(type->GetTypeId() == TypeIds_ListIterator)",
                                "type->GetTypeId() == TypeIds_ListIterator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->count = (list->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).count;
  return;
}

Assistant:

JavascriptListIterator::JavascriptListIterator(DynamicType* type, ListForListIterator* list) :
        DynamicObject(type),
        listForIterator(list),
        index(0)
    {
        Assert(type->GetTypeId() == TypeIds_ListIterator);
        count = list->Count();
    }